

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall t_c_glib_generator::generate_xception(t_c_glib_generator *this,t_struct *tstruct)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  string *psVar3;
  string *psVar4;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  string name_uc;
  string name_lc;
  string name_u;
  string name;
  string sStack_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string(local_38,(string *)CONCAT44(extraout_var,iVar5));
  std::__cxx11::string::string((string *)&local_58,local_38);
  initial_caps_to_underscores(&local_d8,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_78,(string *)&local_d8);
  to_lower_case(&local_f8,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_98,(string *)&local_d8);
  to_upper_case(&sStack_118,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  generate_object(this,tstruct);
  poVar1 = &this->f_types_;
  poVar6 = std::operator<<((ostream *)poVar1,"/* exception */");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"typedef enum");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"{");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_b8);
  psVar3 = &this->nspace_uc;
  poVar6 = std::operator<<(poVar6,(string *)psVar3);
  poVar6 = std::operator<<(poVar6,(string *)&sStack_118);
  poVar6 = std::operator<<(poVar6,"_ERROR_CODE");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b8);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar6 = std::operator<<((ostream *)poVar1,"} ");
  poVar6 = std::operator<<(poVar6,(string *)&this->nspace);
  poVar6 = std::operator<<(poVar6,local_38);
  poVar6 = std::operator<<(poVar6,"Error;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"GQuark ");
  psVar4 = &this->nspace_lc;
  poVar6 = std::operator<<(poVar6,(string *)psVar4);
  poVar6 = std::operator<<(poVar6,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"_error_quark (void);");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"#define ");
  poVar6 = std::operator<<(poVar6,(string *)psVar3);
  poVar6 = std::operator<<(poVar6,(string *)&sStack_118);
  poVar6 = std::operator<<(poVar6,"_ERROR (");
  poVar6 = std::operator<<(poVar6,(string *)psVar4);
  poVar6 = std::operator<<(poVar6,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"_error_quark())");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<((ostream *)&this->f_types_impl_,
                           "/* define the GError domain for exceptions */");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"#define ");
  poVar6 = std::operator<<(poVar6,(string *)psVar3);
  poVar6 = std::operator<<(poVar6,(string *)&sStack_118);
  poVar6 = std::operator<<(poVar6,"_ERROR_DOMAIN \"");
  poVar6 = std::operator<<(poVar6,(string *)psVar4);
  poVar6 = std::operator<<(poVar6,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"_error_quark\"");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"GQuark");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,(string *)psVar4);
  poVar6 = std::operator<<(poVar6,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"_error_quark (void)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"{");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"  return g_quark_from_static_string (");
  poVar6 = std::operator<<(poVar6,(string *)psVar3);
  poVar6 = std::operator<<(poVar6,(string *)&sStack_118);
  poVar6 = std::operator<<(poVar6,"_ERROR_DOMAIN);");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_c_glib_generator::generate_xception(t_struct* tstruct) {
  string name = tstruct->get_name();
  string name_u = initial_caps_to_underscores(name);
  string name_lc = to_lower_case(name_u);
  string name_uc = to_upper_case(name_u);

  generate_object(tstruct);

  f_types_ << "/* exception */" << endl
           << "typedef enum" << endl
           << "{" << endl;
  indent_up();
  f_types_ << indent() << this->nspace_uc << name_uc << "_ERROR_CODE" << endl;
  indent_down();
  f_types_ << "} " << this->nspace << name << "Error;" << endl
           << endl
           << "GQuark " << this->nspace_lc << name_lc
           << "_error_quark (void);" << endl
           << "#define " << this->nspace_uc << name_uc << "_ERROR ("
           << this->nspace_lc << name_lc << "_error_quark())" << endl
           << endl
           << endl;

  f_types_impl_ << "/* define the GError domain for exceptions */" << endl << "#define "
                << this->nspace_uc << name_uc << "_ERROR_DOMAIN \"" << this->nspace_lc << name_lc
                << "_error_quark\"" << endl << "GQuark" << endl << this->nspace_lc << name_lc
                << "_error_quark (void)" << endl << "{" << endl
                << "  return g_quark_from_static_string (" << this->nspace_uc << name_uc
                << "_ERROR_DOMAIN);" << endl << "}" << endl << endl;
}